

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

Abc_Obj_t * Abc_NodeHasUniqueCoFanout(Abc_Obj_t *pNode)

{
  Abc_Obj_t *pObj;
  int iVar1;
  char *__s1;
  char *__s2;
  long lVar2;
  Abc_Obj_t *pObj_00;
  
  iVar1 = (pNode->vFanouts).nSize;
  if (iVar1 < 1) {
LAB_0087730b:
    pObj_00 = (Abc_Obj_t *)0x0;
  }
  else {
    lVar2 = 0;
    pObj_00 = (Abc_Obj_t *)0x0;
    do {
      pObj = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar2]];
      if (((*(uint *)&pObj->field_0x14 >> 10 & 1) == 0) &&
         ((*(uint *)&pObj->field_0x14 & 0xf) - 3 < 2)) {
        if (pObj_00 == (Abc_Obj_t *)0x0) {
          if ((pObj->vFanins).nSize != 1) {
            __assert_fail("Abc_ObjFaninNum(pFanout) == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                          ,0x364,"Abc_Obj_t *Abc_NodeHasUniqueCoFanout(Abc_Obj_t *)");
          }
          pObj_00 = pObj;
          if ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray] != pNode) {
            __assert_fail("Abc_ObjFanin0(pFanout) == pNode",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                          ,0x365,"Abc_Obj_t *Abc_NodeHasUniqueCoFanout(Abc_Obj_t *)");
          }
        }
        else {
          __s1 = Abc_ObjName(pObj_00);
          __s2 = Abc_ObjName(pObj);
          iVar1 = strcmp(__s1,__s2);
          if (iVar1 != 0) goto LAB_0087730b;
          iVar1 = (pNode->vFanouts).nSize;
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  return pObj_00;
}

Assistant:

Abc_Obj_t * Abc_NodeHasUniqueCoFanout( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanout, * pFanoutCo;
    int i;
    pFanoutCo = NULL;
    Abc_ObjForEachFanout( pNode, pFanout, i )
    {
        if ( !Abc_ObjIsCo(pFanout) )
            continue;
        if ( Abc_ObjFaninC0(pFanout) )
            continue;
        if ( pFanoutCo == NULL )
        {
            assert( Abc_ObjFaninNum(pFanout) == 1 );
            assert( Abc_ObjFanin0(pFanout) == pNode );
            pFanoutCo = pFanout;
            continue;
        }
        if ( strcmp( Abc_ObjName(pFanoutCo), Abc_ObjName(pFanout) ) ) // they have diff names
            return NULL;
    }
    return pFanoutCo;
}